

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::bindingsParameters(Kvm *this,Value *bindings)

{
  Value *pVVar1;
  Value *result;
  GcGuard guard;
  Value *local_30;
  GcGuard local_28;
  
  pVVar1 = this->NIL;
  if (pVVar1 != bindings) {
    local_30 = (Value *)0x0;
    local_28.gc_ = &this->gc_;
    local_28.times_ = 0;
    GcGuard::pushLocalStackRoot(&local_28,&local_30);
    local_30 = bindingsParameters(this,*(Value **)&bindings[1].type_);
    pVVar1 = makeCell(this,(Value *)bindings[1]._vptr_Value[3],local_30);
    local_30 = pVVar1;
    GcGuard::~GcGuard(&local_28);
  }
  return pVVar1;
}

Assistant:

const Value* Kvm::bindingsParameters(const Value *bindings)
{
    if (bindings == NIL) return NIL;

    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = bindingsParameters(cdr(bindings));
    result = makeCell(bindingParameter(car(bindings)), result);
    return result;
}